

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QScreen * __thiscall QWidget::screen(QWidget *this)

{
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  QWidget *pQVar4;
  QTLWExtra *pQVar5;
  long in_FS_OFFSET;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QObject *)QWidgetPrivate::associatedScreen(*(QWidgetPrivate **)&this->field_0x8);
  if (pQVar3 == (QObject *)0x0) {
    pQVar4 = window(this);
    if (pQVar4 != (QWidget *)0x0) {
      pQVar5 = QWidgetPrivate::topData(*(QWidgetPrivate **)&pQVar4->field_0x8);
      if (pQVar5 != (QTLWExtra *)0x0) {
        bVar2 = QPointer::operator_cast_to_bool((QPointer *)&pQVar5->initialScreen);
        if (bVar2) {
          pDVar1 = (pQVar5->initialScreen).wp.d;
          if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
            pQVar3 = (QObject *)0x0;
          }
          else {
            pQVar3 = (pQVar5->initialScreen).wp.value;
          }
          goto LAB_002f0e9c;
        }
      }
      local_28 = QRect::center(&pQVar4->data->crect);
      pQVar3 = (QObject *)QGuiApplication::screenAt(&local_28);
      if (pQVar3 != (QObject *)0x0) goto LAB_002f0e9c;
    }
    pQVar3 = (QObject *)QGuiApplication::primaryScreen();
  }
LAB_002f0e9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QScreen *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QScreen *QWidget::screen() const
{
    Q_D(const QWidget);
    if (auto associatedScreen = d->associatedScreen())
        return associatedScreen;
    if (auto topLevel = window()) {
        if (auto topData = qt_widget_private(topLevel)->topData()) {
            if (topData->initialScreen)
                return topData->initialScreen;
        }
        if (auto screenByPos = QGuiApplication::screenAt(topLevel->geometry().center()))
            return screenByPos;
    }
    return QGuiApplication::primaryScreen();
}